

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  _Rb_tree_header *p_Var1;
  cmTarget *pcVar2;
  cmGeneratorTarget *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  pointer ppcVar6;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_58;
  pointer local_50;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> local_48;
  
  if (targetTypes == AllTargets) {
    ppcVar6 = (mf->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_50 = (mf->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar6 != local_50) {
      do {
        pcVar2 = *ppcVar6;
        this_00 = (cmGeneratorTarget *)operator_new(0x8c0);
        cmGeneratorTarget::cmGeneratorTarget(this_00,pcVar2,lg);
        local_58._M_head_impl = this_00;
        cmLocalGenerator::AddGeneratorTarget
                  (lg,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &local_58);
        std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                  ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                   &local_58);
        ppcVar6 = ppcVar6 + 1;
      } while (ppcVar6 != local_50);
    }
  }
  cmMakefile::GetImportedTargets(&local_48,mf);
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var1 = &(importedMap->_M_t)._M_impl.super__Rb_tree_header;
    ppcVar6 = local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      p_Var4 = (importedMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = p_Var1;
      if (p_Var4 != (_Base_ptr)0x0) {
        pcVar2 = *ppcVar6;
        p_Var3 = &p_Var1->_M_header;
        do {
          if (*(cmTarget **)(p_Var4 + 1) >= pcVar2) {
            p_Var3 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(cmTarget **)(p_Var4 + 1) < pcVar2];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
           (p_Var5 = (_Rb_tree_header *)p_Var3,
           pcVar2 < (cmTarget *)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
          p_Var5 = p_Var1;
        }
      }
      cmLocalGenerator::AddImportedGeneratorTarget(lg,*(cmGeneratorTarget **)(p_Var5 + 1));
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
  TargetTypes targetTypes, cmMakefile* mf, cmLocalGenerator* lg,
  std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets) {
    for (cmTarget* target : mf->GetOrderedTargets()) {
      lg->AddGeneratorTarget(cm::make_unique<cmGeneratorTarget>(target, lg));
    }
  }

  for (cmTarget* t : mf->GetImportedTargets()) {
    lg->AddImportedGeneratorTarget(importedMap.find(t)->second);
  }
}